

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj2yaml_Error.cpp
# Opt level: O2

string * __thiscall
(anonymous_namespace)::_obj2yaml_error_category::message_abi_cxx11_
          (string *__return_storage_ptr__,void *this,int ev)

{
  allocator<char> *__a;
  char *__s;
  allocator<char> local_15;
  allocator<char> local_14;
  allocator<char> local_13;
  allocator<char> local_12;
  allocator<char> local_11;
  
  switch(ev) {
  case 0:
    __s = "Success";
    __a = &local_15;
    break;
  case 1:
    __s = "No such file.";
    __a = &local_14;
    break;
  case 2:
    __s = "Unrecognized file type.";
    __a = &local_13;
    break;
  case 3:
    __s = "Unsupported object file format.";
    __a = &local_12;
    break;
  case 4:
    __s = "Feature not yet implemented.";
    __a = &local_11;
    break;
  default:
    llvm::llvm_unreachable_internal
              ("An enumerator of obj2yaml_error does not have a message defined.",
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/obj2yaml_Error.cpp"
               ,0x2b);
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  return __return_storage_ptr__;
}

Assistant:

std::string _obj2yaml_error_category::message(int ev) const {
  switch (static_cast<obj2yaml_error>(ev)) {
  case obj2yaml_error::success:
    return "Success";
  case obj2yaml_error::file_not_found:
    return "No such file.";
  case obj2yaml_error::unrecognized_file_format:
    return "Unrecognized file type.";
  case obj2yaml_error::unsupported_obj_file_format:
    return "Unsupported object file format.";
  case obj2yaml_error::not_implemented:
    return "Feature not yet implemented.";
  }
  llvm_unreachable("An enumerator of obj2yaml_error does not have a message "
                   "defined.");
}